

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

void __thiscall ChainstateManager::CheckBlockIndex(ChainstateManager *this)

{
  long lVar1;
  Chainstate *pCVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  size_type sVar7;
  type *ptVar8;
  size_type sVar9;
  CBlockIndex *pCVar10;
  CBlockIndex *pCVar11;
  reference ppCVar12;
  Chainstate *pCVar13;
  size_type sVar14;
  pointer ppVar15;
  CBlockIndex *pCVar16;
  CBlockIndex *pCVar17;
  long in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>,_std::_Rb_tree_iterator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>_>
  pVar18;
  bool is_active;
  Chainstate *c_2;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> *__range3_1;
  bool foundInUnlinked;
  Chainstate *c_1;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> *__range2;
  Chainstate *c;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> *__range3;
  CBlockIndex *pindexFirstNotTreeValid;
  CBlockIndex *pindexFirstInvalid;
  int nHeight;
  size_t nNodes;
  type *block_index;
  type *_;
  BlockMap *__range1;
  pair<std::_Rb_tree_iterator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>,_std::_Rb_tree_iterator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>_>
  rangePar;
  CBlockIndex *pindexPar;
  pair<std::_Rb_tree_iterator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>,_std::_Rb_tree_iterator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>_>
  range;
  iterator __end3_1;
  iterator __begin3_1;
  pair<std::_Rb_tree_iterator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>,_std::_Rb_tree_iterator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>_>
  rangeUnlinked;
  iterator __end2;
  iterator __begin2;
  iterator __end3;
  iterator __begin3;
  anon_class_96_12_0591e926 snap_update_firsts;
  CBlockIndex *snap_first_nosv;
  CBlockIndex *snap_first_nocv;
  CBlockIndex *snap_first_notv;
  CBlockIndex *snap_first_notx;
  CBlockIndex *snap_first_missing;
  CBlockIndex *snap_base;
  CBlockIndex *pindexFirstNotScriptsValid;
  CBlockIndex *pindexFirstNotChainValid;
  CBlockIndex *pindexFirstNotTransactionsValid;
  CBlockIndex *pindexFirstNeverProcessed;
  CBlockIndex *pindexFirstMissing;
  CBlockIndex *pindex;
  iterator __end1;
  iterator __begin1;
  CChain best_hdr_chain;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock40;
  multimap<CBlockIndex_*,_CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>_>
  forward;
  ChainstateManager *in_stack_fffffffffffffb68;
  CBlockIndex *in_stack_fffffffffffffb70;
  ChainstateManager *in_stack_fffffffffffffb78;
  CBlockIndex *in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb88;
  uint in_stack_fffffffffffffb8c;
  CBlockIndex *in_stack_fffffffffffffb90;
  char *in_stack_fffffffffffffb98;
  AnnotatedMixin<std::recursive_mutex> *in_stack_fffffffffffffba0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_fffffffffffffba8;
  _Rb_tree_iterator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_> in_stack_fffffffffffffbb8;
  _Rb_tree_iterator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_> local_440;
  bool local_383;
  bool local_361;
  bool local_359;
  bool local_351;
  CBlockIndex *local_278;
  CBlockIndex *local_270;
  int local_264;
  long local_260;
  CBlockIndex *local_c8;
  CBlockIndex *local_c0;
  CBlockIndex *local_b8;
  CBlockIndex *local_b0;
  CBlockIndex *local_a8;
  CBlockIndex *local_a0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = ShouldCheckBlockIndex(in_stack_fffffffffffffb78);
  if (bVar3) {
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
              ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffb68);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
               (char *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c,
               SUB41((uint)in_stack_fffffffffffffb88 >> 0x18,0));
    ActiveChain(in_stack_fffffffffffffb68);
    iVar6 = CChain::Height((CChain *)in_stack_fffffffffffffb68);
    if (-1 < iVar6) {
      CChain::CChain((CChain *)in_stack_fffffffffffffb68);
      if (*(long *)(in_RDI + 0xce8) == 0) {
        __assert_fail("m_best_header",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ,0x1469,"void ChainstateManager::CheckBlockIndex()");
      }
      CChain::SetTip((CChain *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                     in_stack_fffffffffffffb80);
      std::
      multimap<CBlockIndex_*,_CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>_>
      ::multimap((multimap<CBlockIndex_*,_CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>_>
                  *)in_stack_fffffffffffffb68);
      std::
      unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
      ::begin((unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
               *)in_stack_fffffffffffffb70);
      std::
      unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
      ::end((unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
             *)in_stack_fffffffffffffb70);
      while (bVar3 = std::__detail::operator==
                               ((_Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true> *)
                                in_stack_fffffffffffffb78,
                                (_Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true> *)
                                in_stack_fffffffffffffb70), ((bVar3 ^ 0xffU) & 1) != 0) {
        std::__detail::_Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true>::operator*
                  ((_Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true> *)
                   in_stack_fffffffffffffb68);
        std::get<0ul,uint256_const,CBlockIndex>
                  ((pair<const_uint256,_CBlockIndex> *)in_stack_fffffffffffffb68);
        ptVar8 = std::get<1ul,uint256_const,CBlockIndex>
                           ((pair<const_uint256,_CBlockIndex> *)in_stack_fffffffffffffb68);
        bVar3 = CChain::Contains((CChain *)in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
        if (!bVar3) {
          if (ptVar8->pprev == (CBlockIndex *)0x0) {
            __assert_fail("block_index.pprev",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                          ,0x1471,"void ChainstateManager::CheckBlockIndex()");
          }
          std::
          multimap<CBlockIndex*,CBlockIndex*,std::less<CBlockIndex*>,std::allocator<std::pair<CBlockIndex*const,CBlockIndex*>>>
          ::emplace<CBlockIndex*&,CBlockIndex*>
                    ((multimap<CBlockIndex_*,_CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>_>
                      *)in_stack_fffffffffffffb80,(CBlockIndex **)in_stack_fffffffffffffb78,
                     (CBlockIndex **)in_stack_fffffffffffffb70);
        }
        std::__detail::_Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true>::
        operator++((_Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true> *)
                   in_stack_fffffffffffffb68);
      }
      sVar9 = std::
              multimap<CBlockIndex_*,_CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>_>
              ::size((multimap<CBlockIndex_*,_CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>_>
                      *)in_stack_fffffffffffffb68);
      iVar6 = CChain::Height((CChain *)in_stack_fffffffffffffb68);
      sVar7 = std::
              unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
              ::size((unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
                      *)in_stack_fffffffffffffb68);
      if (sVar9 + (long)iVar6 + 1 != sVar7) {
        __assert_fail("forward.size() + best_hdr_chain.Height() + 1 == m_blockman.m_block_index.size()"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ,0x1475,"void ChainstateManager::CheckBlockIndex()");
      }
      local_a0 = CChain::operator[]((CChain *)in_stack_fffffffffffffb80,
                                    (int)((ulong)in_stack_fffffffffffffb78 >> 0x20));
      if (local_a0 == (CBlockIndex *)0x0) {
        __assert_fail("pindex",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ,0x1478,"void ChainstateManager::CheckBlockIndex()");
      }
      local_260 = 0;
      local_264 = 0;
      local_270 = (CBlockIndex *)0x0;
      local_a8 = (CBlockIndex *)0x0;
      local_b0 = (CBlockIndex *)0x0;
      local_278 = (CBlockIndex *)0x0;
      local_b8 = (CBlockIndex *)0x0;
      local_c0 = (CBlockIndex *)0x0;
      local_c8 = (CBlockIndex *)0x0;
      pCVar10 = GetSnapshotBaseBlock(in_stack_fffffffffffffb78);
      do {
        if (local_a0 == (CBlockIndex *)0x0) {
LAB_007dce54:
          sVar9 = std::
                  multimap<CBlockIndex_*,_CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>_>
                  ::size((multimap<CBlockIndex_*,_CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>_>
                          *)in_stack_fffffffffffffb68);
          iVar6 = CChain::Height((CChain *)in_stack_fffffffffffffb68);
          if (local_260 != sVar9 + (long)iVar6 + 1) {
            __assert_fail("nNodes == forward.size() + best_hdr_chain.Height() + 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                          ,0x1587,"void ChainstateManager::CheckBlockIndex()");
          }
          std::
          multimap<CBlockIndex_*,_CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>_>
          ::~multimap((multimap<CBlockIndex_*,_CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>_>
                       *)in_stack_fffffffffffffb68);
          CChain::~CChain((CChain *)in_stack_fffffffffffffb68);
          goto LAB_007dcee9;
        }
        local_260 = local_260 + 1;
        if ((local_270 == (CBlockIndex *)0x0) && ((local_a0->nStatus & 0x20) != 0)) {
          local_270 = local_a0;
        }
        if ((local_a8 == (CBlockIndex *)0x0) && ((local_a0->nStatus & 8) == 0)) {
          local_a8 = local_a0;
        }
        if ((local_b0 == (CBlockIndex *)0x0) && (local_a0->nTx == 0)) {
          local_b0 = local_a0;
        }
        if (((local_a0->pprev != (CBlockIndex *)0x0) && (local_278 == (CBlockIndex *)0x0)) &&
           ((local_a0->nStatus & 7) < 2)) {
          local_278 = local_a0;
        }
        if (local_a0->pprev != (CBlockIndex *)0x0) {
          if ((local_b8 == (CBlockIndex *)0x0) && ((local_a0->nStatus & 7) < 3)) {
            local_b8 = local_a0;
          }
          if ((local_c0 == (CBlockIndex *)0x0) && ((local_a0->nStatus & 7) < 4)) {
            local_c0 = local_a0;
          }
          if ((local_c8 == (CBlockIndex *)0x0) && ((local_a0->nStatus & 7) < 5)) {
            local_c8 = local_a0;
          }
        }
        pCVar17 = in_stack_fffffffffffffb90;
        if (local_a0->pprev == (CBlockIndex *)0x0) {
          CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_fffffffffffffb78);
          GetConsensus(in_stack_fffffffffffffb68);
          bVar3 = ::operator==((base_blob<256U> *)in_stack_fffffffffffffb78,
                               (base_blob<256U> *)in_stack_fffffffffffffb70);
          if (!bVar3) {
            __assert_fail("pindex->GetBlockHash() == GetConsensus().hashGenesisBlock",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                          ,0x14b3,"void ChainstateManager::CheckBlockIndex()");
          }
          GetAll((ChainstateManager *)in_stack_fffffffffffffbb8._M_node);
          std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::begin
                    ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)
                     in_stack_fffffffffffffb70);
          std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::end
                    ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)
                     in_stack_fffffffffffffb70);
          while (bVar3 = __gnu_cxx::
                         operator==<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                                   ((__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                                     *)in_stack_fffffffffffffb78,
                                    (__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                                     *)in_stack_fffffffffffffb70), ((bVar3 ^ 0xffU) & 1) != 0) {
            __gnu_cxx::
            __normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
            ::operator*((__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                         *)in_stack_fffffffffffffb68);
            pCVar17 = CChain::Genesis((CChain *)in_stack_fffffffffffffb78);
            if ((pCVar17 != (CBlockIndex *)0x0) &&
               (pCVar17 = CChain::Genesis((CChain *)in_stack_fffffffffffffb78), local_a0 != pCVar17)
               ) {
              __assert_fail("pindex == c->m_chain.Genesis()",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                            ,0x14b6,"void ChainstateManager::CheckBlockIndex()");
            }
            __gnu_cxx::
            __normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
            ::operator++((__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                          *)in_stack_fffffffffffffb68);
          }
          std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::~vector
                    ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)
                     in_stack_fffffffffffffb78);
          pCVar17 = in_stack_fffffffffffffb90;
        }
        bVar3 = CBlockIndex::HaveNumChainTxs((CBlockIndex *)in_stack_fffffffffffffb68);
        if ((!bVar3) && (0 < local_a0->nSequenceId)) {
          __assert_fail("pindex->nSequenceId <= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0x14ba,"void ChainstateManager::CheckBlockIndex()");
        }
        if ((*(byte *)(in_RDI + 0xa50) & 1) == 0) {
          if (((local_a0->nStatus & 8) == 0) != (local_a0->nTx == 0)) {
            __assert_fail("!(pindex->nStatus & BLOCK_HAVE_DATA) == (pindex->nTx == 0)",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                          ,0x14bf,"void ChainstateManager::CheckBlockIndex()");
          }
          if (local_a8 != local_b0) {
            __assert_fail("pindexFirstMissing == pindexFirstNeverProcessed",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                          ,0x14c0,"void ChainstateManager::CheckBlockIndex()");
          }
        }
        else if (((local_a0->nStatus & 8) != 0) && (local_a0->nTx == 0)) {
          __assert_fail("pindex->nTx > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0x14c3,"void ChainstateManager::CheckBlockIndex()");
        }
        if (((local_a0->nStatus & 0x10) != 0) && ((local_a0->nStatus & 8) == 0)) {
          __assert_fail("pindex->nStatus & BLOCK_HAVE_DATA",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0x14c5,"void ChainstateManager::CheckBlockIndex()");
        }
        if (((pCVar10 != (CBlockIndex *)0x0) &&
            (pCVar11 = CBlockIndex::GetAncestor(pCVar17,in_stack_fffffffffffffb8c),
            pCVar11 == local_a0)) && ((local_a0->nStatus & 7) < 2)) {
          __assert_fail("(pindex->nStatus & BLOCK_VALID_MASK) >= BLOCK_VALID_TREE",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0x14c8,"void ChainstateManager::CheckBlockIndex()");
        }
        if (2 < (local_a0->nStatus & 7) != (local_a0->nTx != 0)) {
          __assert_fail("((pindex->nStatus & BLOCK_VALID_MASK) >= BLOCK_VALID_TRANSACTIONS) == (pindex->nTx > 0)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0x14cc,"void ChainstateManager::CheckBlockIndex()");
        }
        local_351 = local_b0 == (CBlockIndex *)0x0 || local_a0 == pCVar10;
        bVar3 = CBlockIndex::HaveNumChainTxs((CBlockIndex *)in_stack_fffffffffffffb68);
        if (local_351 != bVar3) {
          __assert_fail("(pindexFirstNeverProcessed == nullptr || pindex == snap_base) == pindex->HaveNumChainTxs()"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0x14cf,"void ChainstateManager::CheckBlockIndex()");
        }
        local_359 = local_b8 == (CBlockIndex *)0x0 || local_a0 == pCVar10;
        bVar3 = CBlockIndex::HaveNumChainTxs((CBlockIndex *)in_stack_fffffffffffffb68);
        if (local_359 != bVar3) {
          __assert_fail("(pindexFirstNotTransactionsValid == nullptr || pindex == snap_base) == pindex->HaveNumChainTxs()"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0x14d0,"void ChainstateManager::CheckBlockIndex()");
        }
        if (local_a0->nHeight != local_264) {
          __assert_fail("pindex->nHeight == nHeight",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0x14d1,"void ChainstateManager::CheckBlockIndex()");
        }
        local_361 = true;
        if (local_a0->pprev != (CBlockIndex *)0x0) {
          local_361 = operator>=((base_uint<256U> *)in_stack_fffffffffffffb78,
                                 (base_uint<256U> *)in_stack_fffffffffffffb70);
        }
        if (local_361 == false) {
          __assert_fail("pindex->pprev == nullptr || pindex->nChainWork >= pindex->pprev->nChainWork"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0x14d2,"void ChainstateManager::CheckBlockIndex()");
        }
        bVar3 = true;
        if ((1 < local_264) && (bVar3 = false, local_a0->pskip != (CBlockIndex *)0x0)) {
          bVar3 = local_a0->pskip->nHeight < local_264;
        }
        if (!bVar3) {
          __assert_fail("nHeight < 2 || (pindex->pskip && (pindex->pskip->nHeight < nHeight))",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0x14d3,"void ChainstateManager::CheckBlockIndex()");
        }
        if (local_278 != (CBlockIndex *)0x0) {
          __assert_fail("pindexFirstNotTreeValid == nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0x14d4,"void ChainstateManager::CheckBlockIndex()");
        }
        if ((3 < (local_a0->nStatus & 7)) && (local_c0 != (CBlockIndex *)0x0)) {
          __assert_fail("pindexFirstNotChainValid == nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0x14d6,"void ChainstateManager::CheckBlockIndex()");
        }
        if ((4 < (local_a0->nStatus & 7)) && (local_c8 != (CBlockIndex *)0x0)) {
          __assert_fail("pindexFirstNotScriptsValid == nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0x14d7,"void ChainstateManager::CheckBlockIndex()");
        }
        if ((local_270 == (CBlockIndex *)0x0) && ((local_a0->nStatus & 0x60) != 0)) {
          __assert_fail("(pindex->nStatus & BLOCK_FAILED_MASK) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0x14da,"void ChainstateManager::CheckBlockIndex()");
        }
        if (local_a0->pprev == (CBlockIndex *)0x0) {
          if (local_a0->m_chain_tx_count != (ulong)local_a0->nTx) {
            __assert_fail("pindex->m_chain_tx_count == pindex->nTx",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                          ,0x14df,"void ChainstateManager::CheckBlockIndex()");
          }
        }
        else if ((local_a0->pprev->m_chain_tx_count == 0) || (local_a0->nTx == 0)) {
          if ((local_a0->m_chain_tx_count != 0) != (local_a0 == pCVar10)) {
            __assert_fail("(pindex->m_chain_tx_count != 0) == (pindex == snap_base)",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                          ,0x14e6,"void ChainstateManager::CheckBlockIndex()");
          }
        }
        else if (local_a0->m_chain_tx_count !=
                 (ulong)local_a0->nTx + local_a0->pprev->m_chain_tx_count) {
          __assert_fail("pindex->m_chain_tx_count == pindex->nTx + pindex->pprev->m_chain_tx_count",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0x14e2,"void ChainstateManager::CheckBlockIndex()");
        }
        GetAll((ChainstateManager *)in_stack_fffffffffffffbb8._M_node);
        std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::begin
                  ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_fffffffffffffb70)
        ;
        std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::end
                  ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_fffffffffffffb70)
        ;
        while (bVar3 = __gnu_cxx::
                       operator==<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                                 ((__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                                   *)in_stack_fffffffffffffb78,
                                  (__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                                   *)in_stack_fffffffffffffb70), ((bVar3 ^ 0xffU) & 1) != 0) {
          ppCVar12 = __gnu_cxx::
                     __normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                     ::operator*((__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                                  *)in_stack_fffffffffffffb68);
          pCVar2 = *ppCVar12;
          pCVar11 = CChain::Tip((CChain *)in_stack_fffffffffffffb78);
          if (pCVar11 != (CBlockIndex *)0x0) {
            CChain::Tip((CChain *)in_stack_fffffffffffffb78);
            bVar3 = ::node::CBlockIndexWorkComparator::operator()
                              ((CBlockIndexWorkComparator *)in_stack_fffffffffffffb80,
                               (CBlockIndex *)in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
            local_383 = false;
            if (!bVar3) {
              local_383 = local_b0 == (CBlockIndex *)0x0 || local_a0 == pCVar10;
            }
            if (local_383) {
              if (((local_270 == (CBlockIndex *)0x0) &&
                  ((((local_a8 == (CBlockIndex *)0x0 ||
                     (pCVar11 = CChain::Tip((CChain *)in_stack_fffffffffffffb78),
                     local_a0 == pCVar11)) ||
                    (pCVar11 = Chainstate::SnapshotBase((Chainstate *)in_stack_fffffffffffffb78),
                    local_a0 == pCVar11)) &&
                   ((pCVar13 = ActiveChainstate(in_stack_fffffffffffffb78), pCVar2 == pCVar13 ||
                    (pCVar11 = CBlockIndex::GetAncestor(pCVar17,in_stack_fffffffffffffb8c),
                    pCVar11 == local_a0)))))) &&
                 (sVar14 = std::
                           set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
                           ::count((set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
                                    *)in_stack_fffffffffffffb78,
                                   (key_type *)in_stack_fffffffffffffb70), sVar14 == 0)) {
                __assert_fail("c->setBlockIndexCandidates.count(pindex)",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                              ,0x1517,"void ChainstateManager::CheckBlockIndex()");
              }
            }
            else {
              sVar14 = std::
                       set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
                       ::count((set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
                                *)in_stack_fffffffffffffb78,(key_type *)in_stack_fffffffffffffb70);
              if (sVar14 != 0) {
                __assert_fail("c->setBlockIndexCandidates.count(pindex) == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                              ,0x151f,"void ChainstateManager::CheckBlockIndex()");
              }
            }
          }
          __gnu_cxx::
          __normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
          ::operator++((__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                        *)in_stack_fffffffffffffb68);
        }
        std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::~vector
                  ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_fffffffffffffb78)
        ;
        std::
        multimap<CBlockIndex_*,_CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>_>
        ::equal_range((multimap<CBlockIndex_*,_CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>_>
                       *)in_stack_fffffffffffffb78,(key_type *)in_stack_fffffffffffffb70);
        bVar3 = false;
        while (bVar4 = std::operator==((_Self *)in_stack_fffffffffffffb78,
                                       (_Self *)in_stack_fffffffffffffb70),
              ((bVar4 ^ 0xffU) & 1) != 0) {
          ppVar15 = std::_Rb_tree_iterator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>::
                    operator->((_Rb_tree_iterator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_> *)
                               in_stack_fffffffffffffb68);
          if (ppVar15->first != local_a0->pprev) {
            __assert_fail("rangeUnlinked.first->first == pindex->pprev",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                          ,0x1526,"void ChainstateManager::CheckBlockIndex()");
          }
          ppVar15 = std::_Rb_tree_iterator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>::
                    operator->((_Rb_tree_iterator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_> *)
                               in_stack_fffffffffffffb68);
          if (ppVar15->second == local_a0) {
            bVar3 = true;
            break;
          }
          std::_Rb_tree_iterator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>::operator++
                    ((_Rb_tree_iterator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_> *)
                     in_stack_fffffffffffffb80,(int)((ulong)in_stack_fffffffffffffb78 >> 0x20));
        }
        if (((local_a0->pprev != (CBlockIndex *)0x0) && ((local_a0->nStatus & 8) != 0)) &&
           ((local_b0 != (CBlockIndex *)0x0 && ((local_270 == (CBlockIndex *)0x0 && (!bVar3)))))) {
          __assert_fail("foundInUnlinked",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0x152f,"void ChainstateManager::CheckBlockIndex()");
        }
        if (((local_a0->nStatus & 8) == 0) && (bVar3)) {
          __assert_fail("!foundInUnlinked",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0x1531,"void ChainstateManager::CheckBlockIndex()");
        }
        if ((local_a8 == (CBlockIndex *)0x0) && (bVar3)) {
          __assert_fail("!foundInUnlinked",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0x1532,"void ChainstateManager::CheckBlockIndex()");
        }
        if ((((local_a0->pprev != (CBlockIndex *)0x0) && ((local_a0->nStatus & 8) != 0)) &&
            (local_b0 == (CBlockIndex *)0x0)) && (local_a8 != (CBlockIndex *)0x0)) {
          if ((*(byte *)(in_RDI + 0xa50) & 1) == 0) {
            __assert_fail("m_blockman.m_have_pruned",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                          ,0x1535,"void ChainstateManager::CheckBlockIndex()");
          }
          GetAll((ChainstateManager *)in_stack_fffffffffffffbb8._M_node);
          std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::begin
                    ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)
                     in_stack_fffffffffffffb70);
          std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::end
                    ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)
                     in_stack_fffffffffffffb70);
          while (bVar4 = __gnu_cxx::
                         operator==<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                                   ((__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                                     *)in_stack_fffffffffffffb78,
                                    (__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                                     *)in_stack_fffffffffffffb70), ((bVar4 ^ 0xffU) & 1) != 0) {
            ppCVar12 = __gnu_cxx::
                       __normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                       ::operator*((__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                                    *)in_stack_fffffffffffffb68);
            pCVar2 = *ppCVar12;
            pCVar13 = ActiveChainstate(in_stack_fffffffffffffb78);
            CChain::Tip((CChain *)in_stack_fffffffffffffb78);
            bVar5 = ::node::CBlockIndexWorkComparator::operator()
                              ((CBlockIndexWorkComparator *)in_stack_fffffffffffffb80,
                               (CBlockIndex *)in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
            bVar4 = false;
            if (!bVar5) {
              sVar14 = std::
                       set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
                       ::count((set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
                                *)in_stack_fffffffffffffb78,(key_type *)in_stack_fffffffffffffb70);
              bVar4 = sVar14 == 0;
            }
            if ((((bVar4) && (local_270 == (CBlockIndex *)0x0)) &&
                ((pCVar2 == pCVar13 ||
                 (pCVar11 = CBlockIndex::GetAncestor(pCVar17,in_stack_fffffffffffffb8c),
                 pCVar11 == local_a0)))) && (!bVar3)) {
              __assert_fail("foundInUnlinked",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                            ,0x1543,"void ChainstateManager::CheckBlockIndex()");
            }
            __gnu_cxx::
            __normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
            ::operator++((__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                          *)in_stack_fffffffffffffb68);
          }
          std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::~vector
                    ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)
                     in_stack_fffffffffffffb78);
        }
        CheckBlockIndex::anon_class_96_12_0591e926::operator()
                  ((anon_class_96_12_0591e926 *)in_stack_fffffffffffffb68);
        std::
        multimap<CBlockIndex_*,_CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>_>
        ::equal_range((multimap<CBlockIndex_*,_CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>_>
                       *)in_stack_fffffffffffffb78,(key_type *)in_stack_fffffffffffffb70);
        bVar3 = std::operator==((_Self *)in_stack_fffffffffffffb78,
                                (_Self *)in_stack_fffffffffffffb70);
        if (((bVar3 ^ 0xffU) & 1) == 0) {
          bVar3 = CChain::Contains((CChain *)in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
          if (bVar3) {
            local_264 = local_264 + 1;
            local_a0 = CChain::operator[]((CChain *)in_stack_fffffffffffffb80,
                                          (int)((ulong)in_stack_fffffffffffffb78 >> 0x20));
            in_stack_fffffffffffffb90 = pCVar17;
            if (local_a0 == (CBlockIndex *)0x0) goto LAB_007dce54;
          }
          else {
            while (in_stack_fffffffffffffb90 = pCVar17, local_a0 != (CBlockIndex *)0x0) {
              CheckBlockIndex::anon_class_96_12_0591e926::operator()
                        ((anon_class_96_12_0591e926 *)in_stack_fffffffffffffb68);
              if (local_a0 == local_270) {
                local_270 = (CBlockIndex *)0x0;
              }
              if (local_a0 == local_a8) {
                local_a8 = (CBlockIndex *)0x0;
              }
              if (local_a0 == local_b0) {
                local_b0 = (CBlockIndex *)0x0;
              }
              if (local_a0 == local_278) {
                local_278 = (CBlockIndex *)0x0;
              }
              if (local_a0 == local_b8) {
                local_b8 = (CBlockIndex *)0x0;
              }
              if (local_a0 == local_c0) {
                local_c0 = (CBlockIndex *)0x0;
              }
              if (local_a0 == local_c8) {
                local_c8 = (CBlockIndex *)0x0;
              }
              in_stack_fffffffffffffb90 = local_a0->pprev;
              pVar18 = std::
                       multimap<CBlockIndex_*,_CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>_>
                       ::equal_range((multimap<CBlockIndex_*,_CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>_>
                                      *)in_stack_fffffffffffffb78,
                                     (key_type *)in_stack_fffffffffffffb70);
              while( true ) {
                in_stack_fffffffffffffbb8 = pVar18.second._M_node;
                local_440 = pVar18.first._M_node;
                ppVar15 = std::_Rb_tree_iterator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>::
                          operator->((_Rb_tree_iterator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>
                                      *)in_stack_fffffffffffffb68);
                if (ppVar15->second == local_a0) break;
                bVar3 = std::operator==((_Self *)in_stack_fffffffffffffb78,
                                        (_Self *)in_stack_fffffffffffffb70);
                if (((bVar3 ^ 0xffU) & 1) == 0) {
                  __assert_fail("rangePar.first != rangePar.second",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                                ,0x156e,"void ChainstateManager::CheckBlockIndex()");
                }
                std::_Rb_tree_iterator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>::operator++
                          ((_Rb_tree_iterator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_> *)
                           in_stack_fffffffffffffb80,(int)((ulong)in_stack_fffffffffffffb78 >> 0x20)
                          );
                pVar18.second._M_node = in_stack_fffffffffffffbb8._M_node;
                pVar18.first._M_node = local_440._M_node;
              }
              std::_Rb_tree_iterator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>::operator++
                        ((_Rb_tree_iterator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_> *)
                         in_stack_fffffffffffffb80,(int)((ulong)in_stack_fffffffffffffb78 >> 0x20));
              bVar3 = std::operator==((_Self *)in_stack_fffffffffffffb78,
                                      (_Self *)in_stack_fffffffffffffb70);
              if (((bVar3 ^ 0xffU) & 1) != 0) {
                ppVar15 = std::_Rb_tree_iterator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>::
                          operator->((_Rb_tree_iterator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>
                                      *)in_stack_fffffffffffffb68);
                local_a0 = ppVar15->second;
                in_stack_fffffffffffffb90 = pCVar17;
                break;
              }
              pCVar11 = in_stack_fffffffffffffb90;
              pCVar16 = CChain::operator[]((CChain *)in_stack_fffffffffffffb80,
                                           (int)((ulong)in_stack_fffffffffffffb78 >> 0x20));
              if (pCVar11 == pCVar16) {
                local_a0 = CChain::operator[]((CChain *)in_stack_fffffffffffffb80,
                                              (int)((ulong)in_stack_fffffffffffffb78 >> 0x20));
                in_stack_fffffffffffffb8c = (uint)(local_a0 == (CBlockIndex *)0x0);
                pCVar17 = CChain::Tip((CChain *)in_stack_fffffffffffffb78);
                if (in_stack_fffffffffffffb8c != (in_stack_fffffffffffffb90 == pCVar17)) {
                  __assert_fail("(pindex == nullptr) == (pindexPar == best_hdr_chain.Tip())",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                                ,0x157b,"void ChainstateManager::CheckBlockIndex()");
                }
                break;
              }
              local_264 = local_264 + -1;
              local_a0 = in_stack_fffffffffffffb90;
            }
          }
        }
        else {
          ppVar15 = std::_Rb_tree_iterator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>::
                    operator->((_Rb_tree_iterator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_> *)
                               in_stack_fffffffffffffb68);
          local_a0 = ppVar15->second;
          local_264 = local_264 + 1;
          in_stack_fffffffffffffb90 = pCVar17;
        }
      } while( true );
    }
    sVar7 = std::
            unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
            ::size((unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
                    *)in_stack_fffffffffffffb68);
    if (1 < sVar7) {
      __assert_fail("m_blockman.m_block_index.size() <= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                    ,0x145f,"void ChainstateManager::CheckBlockIndex()");
    }
LAB_007dcee9:
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffb68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ChainstateManager::CheckBlockIndex()
{
    if (!ShouldCheckBlockIndex()) {
        return;
    }

    LOCK(cs_main);

    // During a reindex, we read the genesis block and call CheckBlockIndex before ActivateBestChain,
    // so we have the genesis block in m_blockman.m_block_index but no active chain. (A few of the
    // tests when iterating the block tree require that m_chain has been initialized.)
    if (ActiveChain().Height() < 0) {
        assert(m_blockman.m_block_index.size() <= 1);
        return;
    }

    // Build forward-pointing data structure for the entire block tree.
    // For performance reasons, indexes of the best header chain are stored in a vector (within CChain).
    // All remaining blocks are stored in a multimap.
    // The best header chain can differ from the active chain: E.g. its entries may belong to blocks that
    // are not yet validated.
    CChain best_hdr_chain;
    assert(m_best_header);
    best_hdr_chain.SetTip(*m_best_header);

    std::multimap<CBlockIndex*,CBlockIndex*> forward;
    for (auto& [_, block_index] : m_blockman.m_block_index) {
        // Only save indexes in forward that are not part of the best header chain.
        if (!best_hdr_chain.Contains(&block_index)) {
            // Only genesis, which must be part of the best header chain, can have a nullptr parent.
            assert(block_index.pprev);
            forward.emplace(block_index.pprev, &block_index);
        }
    }
    assert(forward.size() + best_hdr_chain.Height() + 1 == m_blockman.m_block_index.size());

    CBlockIndex* pindex = best_hdr_chain[0];
    assert(pindex);
    // Iterate over the entire block tree, using depth-first search.
    // Along the way, remember whether there are blocks on the path from genesis
    // block being explored which are the first to have certain properties.
    size_t nNodes = 0;
    int nHeight = 0;
    CBlockIndex* pindexFirstInvalid = nullptr; // Oldest ancestor of pindex which is invalid.
    CBlockIndex* pindexFirstMissing = nullptr; // Oldest ancestor of pindex which does not have BLOCK_HAVE_DATA, since assumeutxo snapshot if used.
    CBlockIndex* pindexFirstNeverProcessed = nullptr; // Oldest ancestor of pindex for which nTx == 0, since assumeutxo snapshot if used.
    CBlockIndex* pindexFirstNotTreeValid = nullptr; // Oldest ancestor of pindex which does not have BLOCK_VALID_TREE (regardless of being valid or not).
    CBlockIndex* pindexFirstNotTransactionsValid = nullptr; // Oldest ancestor of pindex which does not have BLOCK_VALID_TRANSACTIONS (regardless of being valid or not), since assumeutxo snapshot if used.
    CBlockIndex* pindexFirstNotChainValid = nullptr; // Oldest ancestor of pindex which does not have BLOCK_VALID_CHAIN (regardless of being valid or not), since assumeutxo snapshot if used.
    CBlockIndex* pindexFirstNotScriptsValid = nullptr; // Oldest ancestor of pindex which does not have BLOCK_VALID_SCRIPTS (regardless of being valid or not), since assumeutxo snapshot if used.

    // After checking an assumeutxo snapshot block, reset pindexFirst pointers
    // to earlier blocks that have not been downloaded or validated yet, so
    // checks for later blocks can assume the earlier blocks were validated and
    // be stricter, testing for more requirements.
    const CBlockIndex* snap_base{GetSnapshotBaseBlock()};
    CBlockIndex *snap_first_missing{}, *snap_first_notx{}, *snap_first_notv{}, *snap_first_nocv{}, *snap_first_nosv{};
    auto snap_update_firsts = [&] {
        if (pindex == snap_base) {
            std::swap(snap_first_missing, pindexFirstMissing);
            std::swap(snap_first_notx, pindexFirstNeverProcessed);
            std::swap(snap_first_notv, pindexFirstNotTransactionsValid);
            std::swap(snap_first_nocv, pindexFirstNotChainValid);
            std::swap(snap_first_nosv, pindexFirstNotScriptsValid);
        }
    };

    while (pindex != nullptr) {
        nNodes++;
        if (pindexFirstInvalid == nullptr && pindex->nStatus & BLOCK_FAILED_VALID) pindexFirstInvalid = pindex;
        if (pindexFirstMissing == nullptr && !(pindex->nStatus & BLOCK_HAVE_DATA)) {
            pindexFirstMissing = pindex;
        }
        if (pindexFirstNeverProcessed == nullptr && pindex->nTx == 0) pindexFirstNeverProcessed = pindex;
        if (pindex->pprev != nullptr && pindexFirstNotTreeValid == nullptr && (pindex->nStatus & BLOCK_VALID_MASK) < BLOCK_VALID_TREE) pindexFirstNotTreeValid = pindex;

        if (pindex->pprev != nullptr) {
            if (pindexFirstNotTransactionsValid == nullptr &&
                    (pindex->nStatus & BLOCK_VALID_MASK) < BLOCK_VALID_TRANSACTIONS) {
                pindexFirstNotTransactionsValid = pindex;
            }

            if (pindexFirstNotChainValid == nullptr &&
                    (pindex->nStatus & BLOCK_VALID_MASK) < BLOCK_VALID_CHAIN) {
                pindexFirstNotChainValid = pindex;
            }

            if (pindexFirstNotScriptsValid == nullptr &&
                    (pindex->nStatus & BLOCK_VALID_MASK) < BLOCK_VALID_SCRIPTS) {
                pindexFirstNotScriptsValid = pindex;
            }
        }

        // Begin: actual consistency checks.
        if (pindex->pprev == nullptr) {
            // Genesis block checks.
            assert(pindex->GetBlockHash() == GetConsensus().hashGenesisBlock); // Genesis block's hash must match.
            for (auto c : GetAll()) {
                if (c->m_chain.Genesis() != nullptr) {
                    assert(pindex == c->m_chain.Genesis()); // The chain's genesis block must be this block.
                }
            }
        }
        if (!pindex->HaveNumChainTxs()) assert(pindex->nSequenceId <= 0); // nSequenceId can't be set positive for blocks that aren't linked (negative is used for preciousblock)
        // VALID_TRANSACTIONS is equivalent to nTx > 0 for all nodes (whether or not pruning has occurred).
        // HAVE_DATA is only equivalent to nTx > 0 (or VALID_TRANSACTIONS) if no pruning has occurred.
        if (!m_blockman.m_have_pruned) {
            // If we've never pruned, then HAVE_DATA should be equivalent to nTx > 0
            assert(!(pindex->nStatus & BLOCK_HAVE_DATA) == (pindex->nTx == 0));
            assert(pindexFirstMissing == pindexFirstNeverProcessed);
        } else {
            // If we have pruned, then we can only say that HAVE_DATA implies nTx > 0
            if (pindex->nStatus & BLOCK_HAVE_DATA) assert(pindex->nTx > 0);
        }
        if (pindex->nStatus & BLOCK_HAVE_UNDO) assert(pindex->nStatus & BLOCK_HAVE_DATA);
        if (snap_base && snap_base->GetAncestor(pindex->nHeight) == pindex) {
            // Assumed-valid blocks should connect to the main chain.
            assert((pindex->nStatus & BLOCK_VALID_MASK) >= BLOCK_VALID_TREE);
        }
        // There should only be an nTx value if we have
        // actually seen a block's transactions.
        assert(((pindex->nStatus & BLOCK_VALID_MASK) >= BLOCK_VALID_TRANSACTIONS) == (pindex->nTx > 0)); // This is pruning-independent.
        // All parents having had data (at some point) is equivalent to all parents being VALID_TRANSACTIONS, which is equivalent to HaveNumChainTxs().
        // HaveNumChainTxs will also be set in the assumeutxo snapshot block from snapshot metadata.
        assert((pindexFirstNeverProcessed == nullptr || pindex == snap_base) == pindex->HaveNumChainTxs());
        assert((pindexFirstNotTransactionsValid == nullptr || pindex == snap_base) == pindex->HaveNumChainTxs());
        assert(pindex->nHeight == nHeight); // nHeight must be consistent.
        assert(pindex->pprev == nullptr || pindex->nChainWork >= pindex->pprev->nChainWork); // For every block except the genesis block, the chainwork must be larger than the parent's.
        assert(nHeight < 2 || (pindex->pskip && (pindex->pskip->nHeight < nHeight))); // The pskip pointer must point back for all but the first 2 blocks.
        assert(pindexFirstNotTreeValid == nullptr); // All m_blockman.m_block_index entries must at least be TREE valid
        if ((pindex->nStatus & BLOCK_VALID_MASK) >= BLOCK_VALID_TREE) assert(pindexFirstNotTreeValid == nullptr); // TREE valid implies all parents are TREE valid
        if ((pindex->nStatus & BLOCK_VALID_MASK) >= BLOCK_VALID_CHAIN) assert(pindexFirstNotChainValid == nullptr); // CHAIN valid implies all parents are CHAIN valid
        if ((pindex->nStatus & BLOCK_VALID_MASK) >= BLOCK_VALID_SCRIPTS) assert(pindexFirstNotScriptsValid == nullptr); // SCRIPTS valid implies all parents are SCRIPTS valid
        if (pindexFirstInvalid == nullptr) {
            // Checks for not-invalid blocks.
            assert((pindex->nStatus & BLOCK_FAILED_MASK) == 0); // The failed mask cannot be set for blocks without invalid parents.
        }
        // Make sure m_chain_tx_count sum is correctly computed.
        if (!pindex->pprev) {
            // If no previous block, nTx and m_chain_tx_count must be the same.
            assert(pindex->m_chain_tx_count == pindex->nTx);
        } else if (pindex->pprev->m_chain_tx_count > 0 && pindex->nTx > 0) {
            // If previous m_chain_tx_count is set and number of transactions in block is known, sum must be set.
            assert(pindex->m_chain_tx_count == pindex->nTx + pindex->pprev->m_chain_tx_count);
        } else {
            // Otherwise m_chain_tx_count should only be set if this is a snapshot
            // block, and must be set if it is.
            assert((pindex->m_chain_tx_count != 0) == (pindex == snap_base));
        }

        // Chainstate-specific checks on setBlockIndexCandidates
        for (auto c : GetAll()) {
            if (c->m_chain.Tip() == nullptr) continue;
            // Two main factors determine whether pindex is a candidate in
            // setBlockIndexCandidates:
            //
            // - If pindex has less work than the chain tip, it should not be a
            //   candidate, and this will be asserted below. Otherwise it is a
            //   potential candidate.
            //
            // - If pindex or one of its parent blocks back to the genesis block
            //   or an assumeutxo snapshot never downloaded transactions
            //   (pindexFirstNeverProcessed is non-null), it should not be a
            //   candidate, and this will be asserted below. The only exception
            //   is if pindex itself is an assumeutxo snapshot block. Then it is
            //   also a potential candidate.
            if (!CBlockIndexWorkComparator()(pindex, c->m_chain.Tip()) && (pindexFirstNeverProcessed == nullptr || pindex == snap_base)) {
                // If pindex was detected as invalid (pindexFirstInvalid is
                // non-null), it is not required to be in
                // setBlockIndexCandidates.
                if (pindexFirstInvalid == nullptr) {
                    // If pindex and all its parents back to the genesis block
                    // or an assumeutxo snapshot block downloaded transactions,
                    // and the transactions were not pruned (pindexFirstMissing
                    // is null), it is a potential candidate. The check
                    // excludes pruned blocks, because if any blocks were
                    // pruned between pindex and the current chain tip, pindex will
                    // only temporarily be added to setBlockIndexCandidates,
                    // before being moved to m_blocks_unlinked. This check
                    // could be improved to verify that if all blocks between
                    // the chain tip and pindex have data, pindex must be a
                    // candidate.
                    //
                    // If pindex is the chain tip, it also is a potential
                    // candidate.
                    //
                    // If the chainstate was loaded from a snapshot and pindex
                    // is the base of the snapshot, pindex is also a potential
                    // candidate.
                    if (pindexFirstMissing == nullptr || pindex == c->m_chain.Tip() || pindex == c->SnapshotBase()) {
                        // If this chainstate is the active chainstate, pindex
                        // must be in setBlockIndexCandidates. Otherwise, this
                        // chainstate is a background validation chainstate, and
                        // pindex only needs to be added if it is an ancestor of
                        // the snapshot that is being validated.
                        if (c == &ActiveChainstate() || snap_base->GetAncestor(pindex->nHeight) == pindex) {
                            assert(c->setBlockIndexCandidates.count(pindex));
                        }
                    }
                    // If some parent is missing, then it could be that this block was in
                    // setBlockIndexCandidates but had to be removed because of the missing data.
                    // In this case it must be in m_blocks_unlinked -- see test below.
                }
            } else { // If this block sorts worse than the current tip or some ancestor's block has never been seen, it cannot be in setBlockIndexCandidates.
                assert(c->setBlockIndexCandidates.count(pindex) == 0);
            }
        }
        // Check whether this block is in m_blocks_unlinked.
        std::pair<std::multimap<CBlockIndex*,CBlockIndex*>::iterator,std::multimap<CBlockIndex*,CBlockIndex*>::iterator> rangeUnlinked = m_blockman.m_blocks_unlinked.equal_range(pindex->pprev);
        bool foundInUnlinked = false;
        while (rangeUnlinked.first != rangeUnlinked.second) {
            assert(rangeUnlinked.first->first == pindex->pprev);
            if (rangeUnlinked.first->second == pindex) {
                foundInUnlinked = true;
                break;
            }
            rangeUnlinked.first++;
        }
        if (pindex->pprev && (pindex->nStatus & BLOCK_HAVE_DATA) && pindexFirstNeverProcessed != nullptr && pindexFirstInvalid == nullptr) {
            // If this block has block data available, some parent was never received, and has no invalid parents, it must be in m_blocks_unlinked.
            assert(foundInUnlinked);
        }
        if (!(pindex->nStatus & BLOCK_HAVE_DATA)) assert(!foundInUnlinked); // Can't be in m_blocks_unlinked if we don't HAVE_DATA
        if (pindexFirstMissing == nullptr) assert(!foundInUnlinked); // We aren't missing data for any parent -- cannot be in m_blocks_unlinked.
        if (pindex->pprev && (pindex->nStatus & BLOCK_HAVE_DATA) && pindexFirstNeverProcessed == nullptr && pindexFirstMissing != nullptr) {
            // We HAVE_DATA for this block, have received data for all parents at some point, but we're currently missing data for some parent.
            assert(m_blockman.m_have_pruned);
            // This block may have entered m_blocks_unlinked if:
            //  - it has a descendant that at some point had more work than the
            //    tip, and
            //  - we tried switching to that descendant but were missing
            //    data for some intermediate block between m_chain and the
            //    tip.
            // So if this block is itself better than any m_chain.Tip() and it wasn't in
            // setBlockIndexCandidates, then it must be in m_blocks_unlinked.
            for (auto c : GetAll()) {
                const bool is_active = c == &ActiveChainstate();
                if (!CBlockIndexWorkComparator()(pindex, c->m_chain.Tip()) && c->setBlockIndexCandidates.count(pindex) == 0) {
                    if (pindexFirstInvalid == nullptr) {
                        if (is_active || snap_base->GetAncestor(pindex->nHeight) == pindex) {
                            assert(foundInUnlinked);
                        }
                    }
                }
            }
        }
        // assert(pindex->GetBlockHash() == pindex->GetBlockHeader().GetHash()); // Perhaps too slow
        // End: actual consistency checks.


        // Try descending into the first subnode. Always process forks first and the best header chain after.
        snap_update_firsts();
        std::pair<std::multimap<CBlockIndex*,CBlockIndex*>::iterator,std::multimap<CBlockIndex*,CBlockIndex*>::iterator> range = forward.equal_range(pindex);
        if (range.first != range.second) {
            // A subnode not part of the best header chain was found.
            pindex = range.first->second;
            nHeight++;
            continue;
        } else if (best_hdr_chain.Contains(pindex)) {
            // Descend further into best header chain.
            nHeight++;
            pindex = best_hdr_chain[nHeight];
            if (!pindex) break; // we are finished, since the best header chain is always processed last
            continue;
        }
        // This is a leaf node.
        // Move upwards until we reach a node of which we have not yet visited the last child.
        while (pindex) {
            // We are going to either move to a parent or a sibling of pindex.
            snap_update_firsts();
            // If pindex was the first with a certain property, unset the corresponding variable.
            if (pindex == pindexFirstInvalid) pindexFirstInvalid = nullptr;
            if (pindex == pindexFirstMissing) pindexFirstMissing = nullptr;
            if (pindex == pindexFirstNeverProcessed) pindexFirstNeverProcessed = nullptr;
            if (pindex == pindexFirstNotTreeValid) pindexFirstNotTreeValid = nullptr;
            if (pindex == pindexFirstNotTransactionsValid) pindexFirstNotTransactionsValid = nullptr;
            if (pindex == pindexFirstNotChainValid) pindexFirstNotChainValid = nullptr;
            if (pindex == pindexFirstNotScriptsValid) pindexFirstNotScriptsValid = nullptr;
            // Find our parent.
            CBlockIndex* pindexPar = pindex->pprev;
            // Find which child we just visited.
            std::pair<std::multimap<CBlockIndex*,CBlockIndex*>::iterator,std::multimap<CBlockIndex*,CBlockIndex*>::iterator> rangePar = forward.equal_range(pindexPar);
            while (rangePar.first->second != pindex) {
                assert(rangePar.first != rangePar.second); // Our parent must have at least the node we're coming from as child.
                rangePar.first++;
            }
            // Proceed to the next one.
            rangePar.first++;
            if (rangePar.first != rangePar.second) {
                // Move to a sibling not part of the best header chain.
                pindex = rangePar.first->second;
                break;
            } else if (pindexPar == best_hdr_chain[nHeight - 1]) {
                // Move to pindex's sibling on the best-chain, if it has one.
                pindex = best_hdr_chain[nHeight];
                // There will not be a next block if (and only if) parent block is the best header.
                assert((pindex == nullptr) == (pindexPar == best_hdr_chain.Tip()));
                break;
            } else {
                // Move up further.
                pindex = pindexPar;
                nHeight--;
                continue;
            }
        }
    }

    // Check that we actually traversed the entire block index.
    assert(nNodes == forward.size() + best_hdr_chain.Height() + 1);
}